

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O0

void aura_etable_add(aura_export_table *tbl,char *name,char *argfmt,char *retfmt)

{
  long lVar1;
  ENTRY __item;
  int iVar2;
  aura_object *paVar3;
  aura_export_table *paVar4;
  aura_node *paVar5;
  _ENTRY *p_Var6;
  char *pcVar7;
  bool local_59;
  aura_object *target;
  int ret_valid;
  int arg_valid;
  ENTRY *ep;
  ENTRY e;
  int ret;
  char *retfmt_local;
  char *argfmt_local;
  char *name_local;
  aura_export_table *tbl_local;
  
  target._4_4_ = 1;
  target._0_4_ = 1;
  if (tbl->size <= tbl->next) {
    BUG(tbl->owner,"Internal BUG: Insufficient export table storage");
  }
  paVar3 = aura_etable_find(tbl,name);
  if (paVar3 != (aura_object *)0x0) {
    BUG(tbl->owner,"Internal BUG: Duplicate export table entry: %s",name);
  }
  paVar4 = tbl + (long)tbl->next * 3 + 1;
  iVar2 = tbl->next;
  tbl->next = iVar2 + 1;
  paVar4->size = iVar2;
  if (name == (char *)0x0) {
    BUG(tbl->owner,"Internal BUG: object name can\'t be nil");
  }
  paVar5 = (aura_node *)strdup(name);
  paVar4->owner = paVar5;
  if (argfmt != (char *)0x0) {
    p_Var6 = (_ENTRY *)strdup(argfmt);
    (paVar4->index).table = p_Var6;
  }
  if (retfmt != (char *)0x0) {
    pcVar7 = strdup(retfmt);
    *(char **)&(paVar4->index).size = pcVar7;
  }
  if (((argfmt == (char *)0x0) || ((paVar4->index).table != (_ENTRY *)0x0)) &&
     ((retfmt == (char *)0x0 ||
      (lVar1._0_4_ = (paVar4->index).size, lVar1._4_4_ = (paVar4->index).filled, lVar1 != 0)))) {
    if (argfmt != (char *)0x0) {
      paVar5 = (aura_node *)
               aura_fmt_pretty_print(argfmt,(int *)((long)&target + 4),(int *)&paVar4[1].index.size)
      ;
      paVar4[1].owner = paVar5;
    }
    if (retfmt != (char *)0x0) {
      p_Var6 = (_ENTRY *)aura_fmt_pretty_print(retfmt,(int *)&target,(int *)&paVar4[1].index.filled)
      ;
      paVar4[1].index.table = p_Var6;
    }
    local_59 = target._4_4_ != 0 && (int)target != 0;
    paVar4[1].size = (uint)local_59;
    if (paVar4[1].size == 0) {
      slog(0,3,"Object %d (%s) has corrupt export table",(ulong)(uint)paVar4->size,paVar4->owner);
    }
    iVar2 = aura_fmt_len(tbl->owner,argfmt);
    paVar4[2].size = iVar2;
    iVar2 = aura_fmt_len(tbl->owner,retfmt);
    paVar4[2].next = iVar2;
    ep = (ENTRY *)paVar4->owner;
    __item.data = paVar4;
    __item.key = (char *)ep;
    e.key = (char *)paVar4;
    e.data._4_4_ = hsearch_r(__item,ENTER,(ENTRY **)&ret_valid,(hsearch_data *)&tbl->index);
    if (e.data._4_4_ == 0) {
      BUG(tbl->owner,"Internal BUG: Error adding entry to hash table");
    }
    return;
  }
  BUG(tbl->owner,"Internal allocation error");
}

Assistant:

void aura_etable_add(struct aura_export_table * tbl,
		     const char *		name,
		     const char *		argfmt,
		     const char *		retfmt)
{
	int ret;
	ENTRY e, *ep;
	int arg_valid = 1;
	int ret_valid = 1;
	struct aura_object *target;

	if (tbl->next >= tbl->size)
		BUG(tbl->owner, "Internal BUG: Insufficient export table storage");

	target = aura_etable_find(tbl, name);
	if (target != NULL)
		BUG(tbl->owner, "Internal BUG: Duplicate export table entry: %s", name);

	target = &tbl->objects[tbl->next];
	target->id = tbl->next++;
	if (!name)
		BUG(tbl->owner, "Internal BUG: object name can't be nil");
	else
		target->name = strdup(name);

	if (argfmt)
		target->arg_fmt = strdup(argfmt);
	if (retfmt)
		target->ret_fmt = strdup(retfmt);

	if ((argfmt && !target->arg_fmt) ||
	    (retfmt && !target->ret_fmt))
		BUG(tbl->owner, "Internal allocation error");

	if (argfmt)
		target->arg_pprinted = aura_fmt_pretty_print(argfmt, &arg_valid, &target->num_args);

	if (retfmt)
		target->ret_pprinted = aura_fmt_pretty_print(retfmt, &ret_valid, &target->num_rets);

	target->valid = arg_valid && ret_valid;
	if (!target->valid)
		slog(0, SLOG_WARN, "Object %d (%s) has corrupt export table",
		     target->id, target->name);
	/* Calculate the sizes required */
	target->arglen = aura_fmt_len(tbl->owner, argfmt);
	target->retlen = aura_fmt_len(tbl->owner, retfmt);

	/* Add this shit to index */
	e.key = target->name;
	e.data = (char *)target;
	ret = hsearch_r(e, ENTER, &ep, &tbl->index);
	if (!ret)
		BUG(tbl->owner, "Internal BUG: Error adding entry to hash table");
}